

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
ptc::Print<char>::print_backend<std::ostream&,char_const(&)[8],char_const(&)[20],char_const(&)[6]>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*first) [8],
          char (*args) [20],char (*args_1) [6])

{
  size_type sVar1;
  char *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  size_type *local_58;
  ANSI local_44;
  char (*local_40) [8];
  ANSI local_38 [2];
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar5 != 0) {
    uVar8 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    _Unwind_Resume(uVar8);
  }
  local_44 = first;
  bVar4 = is_escape<char[8]>(first,&local_44);
  if ((bVar4) || (sVar1 = (this->pattern)._M_string_length, sVar1 == 0)) {
    sVar7 = strlen(*first);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*first,sVar7);
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar1);
    sVar7 = strlen(*first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,*first,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
  }
  local_44 = first;
  bVar4 = is_escape<char[8]>(first,&local_44);
  pbVar9 = &this->pattern;
  local_58 = &(this->pattern)._M_string_length;
  sVar1 = (this->pattern)._M_string_length;
  if (bVar4) {
    if (sVar1 == 0) {
      sVar7 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*args,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      sVar7 = strlen(*args_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*args_1,sVar7);
      pbVar9 = &this->sep;
      local_58 = &(this->sep)._M_string_length;
      poVar6 = (ostream *)os;
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(pbVar9->_M_dataplus)._M_p,sVar1);
      sVar7 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args,sVar7);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pbVar9->_M_dataplus)._M_p,*local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(pbVar9->_M_dataplus)._M_p,*local_58);
      local_40 = first;
      sVar7 = strlen(*args_1);
      first = local_40;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args_1,sVar7);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pbVar9->_M_dataplus)._M_p,*local_58);
      pbVar9 = &this->sep;
      local_58 = &(this->sep)._M_string_length;
    }
LAB_0010e5d7:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(pbVar9->_M_dataplus)._M_p,*local_58);
  }
  else {
    pcVar2 = (this->sep)._M_dataplus._M_p;
    sVar3 = (this->sep)._M_string_length;
    if (sVar1 != 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar2,sVar3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pbVar9->_M_dataplus)._M_p,*local_58);
      sVar7 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(pbVar9->_M_dataplus)._M_p,*local_58);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(pbVar9->_M_dataplus)._M_p,*local_58);
      local_40 = first;
      sVar7 = strlen(*args_1);
      first = local_40;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args_1,sVar7);
      goto LAB_0010e5d7;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar2,sVar3);
    sVar7 = strlen(*args);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args,sVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    sVar7 = strlen(*args_1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,*args_1,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
  local_44 = generic;
  bVar4 = is_escape<char[8]>(first,&local_44);
  if (!bVar4) {
    local_38[1] = 1;
    bVar4 = is_escape<char[20]>(args,local_38 + 1);
    if (!bVar4) {
      local_38[0] = generic;
      bVar4 = is_escape<char[6]>(args_1,local_38);
      if (!bVar4) goto LAB_0010e653;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\x1b[0m",4);
LAB_0010e653:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }